

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O0

void bhf::ads::ParseStringData(RegistryEntry *value,char **it,istream *param_3,size_t *lineNumber)

{
  unsigned_long uVar1;
  ostream *poVar2;
  runtime_error *this;
  bool bVar3;
  string local_1e0 [48];
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  ulong *local_28;
  size_t *lineNumber_local;
  istream *param_2_local;
  char **it_local;
  RegistryEntry *value_local;
  
  local_28 = lineNumber;
  lineNumber_local = (size_t *)param_3;
  param_2_local = (istream *)it;
  it_local = (char **)value;
  while( true ) {
    bVar3 = false;
    if (**(char **)param_2_local != '\0') {
      bVar3 = *(char *)(*(long *)param_2_local + 1) != '\0';
    }
    if (!bVar3) break;
    RegistryEntry::PushData<char>((RegistryEntry *)it_local,**(char **)param_2_local);
    *(long *)param_2_local = *(long *)param_2_local + 1;
  }
  if (**(char **)param_2_local != '\"') {
    std::__cxx11::stringstream::stringstream(local_1b0);
    uVar1 = std::numeric_limits<unsigned_long>::max();
    if (uVar1 == *local_28) {
      poVar2 = std::operator<<(local_1a0,"Invalid network data: ");
      poVar2 = std::operator<<(poVar2,"missing closing quotation mark");
      std::operator<<(poVar2,'\n');
    }
    else {
      poVar2 = std::operator<<(local_1a0,"Invalid file format: ");
      poVar2 = std::operator<<(poVar2,"missing closing quotation mark");
      poVar2 = std::operator<<(poVar2," in line ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_28);
      std::operator<<(poVar2,'\n');
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(this,local_1e0);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  RegistryEntry::PushData<char>((RegistryEntry *)it_local,'\0');
  return;
}

Assistant:

static void ParseStringData(RegistryEntry& value, const char*& it, std::istream& /*input*/, size_t& lineNumber)
{
    // REG_SZ data should end with a closing quote and null terminator
    while ('\0' != it[0] && '\0' != it[1]) {
        value.PushData(*it);
        ++it;
    }
    if ('\"' != *it) {
        PARSING_EXCEPTION("missing closing quotation mark");
    }
    value.PushData('\0');
}